

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thrift.h
# Opt level: O1

void __thiscall duckdb_apache::thrift::TException::~TException(TException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__TException_004a37e8;
  pcVar1 = (this->message_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->message_).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~TException() noexcept override = default;